

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

void __thiscall
CKey::
Set<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CKey *this,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          pbegin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 pend,bool fCompressedIn)

{
  long lVar1;
  bool bVar2;
  difference_type dVar3;
  pointer __dest;
  reference __src;
  size_type __n;
  byte in_CL;
  byte *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_ffffffffffffffb8;
  CKey *in_stack_ffffffffffffffc0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dVar3 = __gnu_cxx::operator-
                    (in_stack_ffffffffffffffc8,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffffc0);
  if (dVar3 == 0x20) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator[](in_stack_ffffffffffffffc8,(difference_type)in_stack_ffffffffffffffc0);
    UCharCast(&in_stack_ffffffffffffffb8->fCompressed);
    bVar2 = Check(&in_stack_ffffffffffffffb8->fCompressed);
    if (bVar2) {
      MakeKeyData(in_stack_ffffffffffffffc0);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    *)in_stack_ffffffffffffffb8);
      __dest = std::array<unsigned_char,_32UL>::data
                         ((array<unsigned_char,_32UL> *)in_stack_ffffffffffffffb8);
      __src = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](in_stack_ffffffffffffffc8,(difference_type)__dest);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    *)in_stack_ffffffffffffffb8);
      __n = std::array<unsigned_char,_32UL>::size
                      ((array<unsigned_char,_32UL> *)in_stack_ffffffffffffffb8);
      memcpy(__dest,__src,__n);
      *in_RDI = in_CL & 1;
    }
    else {
      ClearKeyData(in_stack_ffffffffffffffb8);
    }
  }
  else {
    ClearKeyData(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Set(const T pbegin, const T pend, bool fCompressedIn)
    {
        if (size_t(pend - pbegin) != std::tuple_size_v<KeyType>) {
            ClearKeyData();
        } else if (Check(UCharCast(&pbegin[0]))) {
            MakeKeyData();
            memcpy(keydata->data(), (unsigned char*)&pbegin[0], keydata->size());
            fCompressed = fCompressedIn;
        } else {
            ClearKeyData();
        }
    }